

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy_s.c
# Opt level: O0

errno_t memcpy_s(void *dest,rsize_t dmax,void *src,rsize_t smax)

{
  long lVar1;
  void *in_RCX;
  char *in_RDX;
  void *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  uint8_t *sp;
  uint8_t *dp;
  errno_t in_stack_ffffffffffffffbc;
  uint8_t value;
  uint32_t len;
  errno_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (char *)0x0) {
    invoke_safe_mem_constraint_handler((char *)0x0,in_RDX,in_stack_ffffffffffffffbc);
    local_c = 400;
  }
  else if (in_RSI == (void *)0x0) {
    invoke_safe_mem_constraint_handler(in_RDI,in_RDX,in_stack_ffffffffffffffbc);
    local_c = 0x191;
  }
  else if (in_RSI < (void *)0x10000001) {
    value = (uint8_t)((ulong)in_RSI >> 0x18);
    len = (uint32_t)((ulong)in_RSI >> 0x20);
    if (in_RCX == (void *)0x0) {
      mem_prim_set(in_RDI,len,value);
      invoke_safe_mem_constraint_handler(in_RDI,in_RDX,in_stack_ffffffffffffffbc);
      local_c = 0x191;
    }
    else if (in_RSI < in_RCX) {
      mem_prim_set(in_RDI,len,value);
      invoke_safe_mem_constraint_handler(in_RDI,in_RDX,in_stack_ffffffffffffffbc);
      local_c = 0x193;
    }
    else if (in_RDX == (char *)0x0) {
      mem_prim_set(in_RDI,len,value);
      invoke_safe_mem_constraint_handler(in_RDI,in_RDX,in_stack_ffffffffffffffbc);
      local_c = 400;
    }
    else if (((in_RDX < in_RDI) && (in_RDI < in_RDX + (long)in_RCX)) ||
            ((in_RDI < in_RDX && (in_RDX < in_RDI + (long)in_RSI)))) {
      mem_prim_set(in_RDI,len,value);
      invoke_safe_mem_constraint_handler(in_RDI,in_RDX,in_stack_ffffffffffffffbc);
      local_c = 0x194;
    }
    else {
      mem_prim_move(in_RDX,in_RCX,(uint32_t)((ulong)in_RDI >> 0x20));
      local_c = 0;
    }
  }
  else {
    invoke_safe_mem_constraint_handler(in_RDI,in_RDX,in_stack_ffffffffffffffbc);
    local_c = 0x193;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
memcpy_s (void *dest, rsize_t dmax, const void *src, rsize_t smax)
{
    uint8_t *dp;
    const uint8_t  *sp;

    dp = dest;
    sp = src;

    if (dp == NULL) {
        invoke_safe_mem_constraint_handler("memcpy_s: dest is NULL",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_mem_constraint_handler("memcpy_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (dmax > RSIZE_MAX_MEM) {
        invoke_safe_mem_constraint_handler("memcpy_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    // AR: This is not a requirement according to the ISO spec - Change?
    // AR: documentation needed on use of the error handlers -
    // AR: default err handler should output to stderr on DEBUG
    // AR: update docs to define return RCNEGATE of the error number
    if (smax == 0) {
        mem_prim_set(dp, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy_s: smax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (smax > dmax) {
        mem_prim_set(dp, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy_s: smax exceeds dmax",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    if (sp == NULL) {
        mem_prim_set(dp, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy_s: src is NULL",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }


    /*
     * overlap is undefined behavior, do not allow
     */
    if( ((dp > sp) && (dp < (sp+smax))) ||
        ((sp > dp) && (sp < (dp+dmax))) ) {
        mem_prim_set(dp, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy_s: overlap undefined",
                   NULL, ESOVRLP);
        return RCNEGATE(ESOVRLP);
    }

    /*
     * now perform the copy
     */
    mem_prim_move(dp, sp, smax);

    return RCNEGATE(EOK);
}